

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginBlock
          (WatWriter *this,LabelType label_type,Block *block,char *text)

{
  byte bVar1;
  Index IVar2;
  bool has_label;
  char *text_local;
  Block *block_local;
  LabelType label_type_local;
  WatWriter *this_local;
  
  WritePutsSpace(this,text);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = (bVar1 ^ 0xff) & 1;
  if (bVar1 != 0) {
    WriteString(this,&block->label,Space);
  }
  WriteTypes(this,&(block->decl).sig.param_types,"param");
  WriteTypes(this,&(block->decl).sig.result_types,"result");
  if (bVar1 == 0) {
    IVar2 = ModuleContext::GetLabelStackSize(&this->super_ModuleContext);
    Writef(this," ;; label = @%u",(ulong)IVar2);
  }
  WriteNewline(this,true);
  ModuleContext::BeginBlock(&this->super_ModuleContext,label_type,block);
  Indent(this);
  return;
}

Assistant:

void WatWriter::WriteBeginBlock(LabelType label_type,
                                const Block& block,
                                const char* text) {
  WritePutsSpace(text);
  bool has_label = !block.label.empty();
  if (has_label) {
    WriteString(block.label, NextChar::Space);
  }
  WriteTypes(block.decl.sig.param_types, "param");
  WriteTypes(block.decl.sig.result_types, "result");
  if (!has_label) {
    Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
  }
  WriteNewline(FORCE_NEWLINE);
  BeginBlock(label_type, block);
  Indent();
}